

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

void Image_Function_Helper::Accumulate
               (AccumulateForm2 accumulate,Image *image,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *result)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 in_RDX;
  ImageTemplate<unsigned_char> *in_RSI;
  code *in_RDI;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffe0;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffe0);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RSI);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RSI);
  (*in_RDI)(in_RSI,0,0,uVar1,uVar2,in_RDX);
  return;
}

Assistant:

void Accumulate( FunctionTable::AccumulateForm2 accumulate,
                     const Image & image, std::vector < uint32_t > & result )
    {
        Image_Function::ParameterValidation( image );

        accumulate( image, 0, 0, image.width(), image.height(), result );
    }